

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Xt __thiscall cppforth::Forth::findDefinition(Forth *this,string *nameToFind)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  reference pcVar5;
  reference this_00;
  size_type sVar6;
  iterator __first;
  difference_type dVar7;
  size_type sVar8;
  difference_type elementNum;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> foundElement;
  SCell wordWid;
  string *name;
  Definition *defn;
  reverse_iterator iend;
  reverse_iterator i;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  Xt nameXt;
  int foundInWordlist;
  size_type nameLength;
  string *nameToFind_local;
  Forth *this_local;
  
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (nameToFind);
  if (sVar4 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    __range2._4_4_ = -1;
    __range2._0_4_ = 0;
    __end2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                       (nameToFind);
    c = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                          (nameToFind);
    while (bVar1 = __gnu_cxx::
                   operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), ((bVar1 ^ 0xffU) & 1) != 0) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar2 = toupper_ascii(*pcVar5);
      *pcVar5 = cVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rbegin
              ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
               &iend);
    std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>::rend
              ((vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_> *)
               &defn);
    while (bVar1 = std::
                   operator==<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                             (&iend,(reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                                     *)&defn), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
                ::operator*(&iend);
      bVar1 = Definition::isHidden(this_00);
      if (!bVar1) {
        sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(&this_00->name);
        if ((sVar4 == sVar6) &&
           (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(nameToFind,&this_00->name), iVar3 == 0)) {
          foundElement._M_current._4_4_ = this_00->searchOrder;
          local_88._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin(&this->searchOrder);
          local_90 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->searchOrder);
          local_80 = std::
                     find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                               (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                          )local_90,(int *)((long)&foundElement._M_current + 4));
          elementNum = (difference_type)
                       std::vector<int,_std::allocator<int>_>::end(&this->searchOrder);
          bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                            (&local_80,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &elementNum);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            __first = std::vector<int,_std::allocator<int>_>::begin(&this->searchOrder);
            dVar7 = std::
                    distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               __first._M_current,local_80);
            if (__range2._4_4_ < dVar7) {
              __range2._4_4_ = (int)dVar7;
              __range2._0_4_ = this_00->numberInVector;
              sVar8 = std::vector<int,_std::allocator<int>_>::size(&this->searchOrder);
              if ((long)__range2._4_4_ == sVar8 - 1) {
                return (Xt)__range2;
              }
            }
          }
        }
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<cppforth::Forth::Definition_*,_std::vector<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>_>_>
      ::operator++(&iend);
    }
    this_local._4_4_ = (Xt)__range2;
  }
  return this_local._4_4_;
}

Assistant:

Xt findDefinition(std::string& nameToFind) {
			auto nameLength = nameToFind.size();
			if (nameLength == 0)
				return 0;
			//std::string Word1{nameToFind};
			int foundInWordlist{-1};
			Xt nameXt{0};  
			for (auto & c: nameToFind) c = toupper_ascii(static_cast<unsigned char>(c));
			for (auto i = definitions.rbegin(), iend=definitions.rend(); i != iend ; ++i) {
				auto& defn = *i;
				//if (!defn.isFindable())
				if (defn.isHidden())
					continue;
				auto& name = defn.name;
				if(nameLength==name.length() && nameToFind.compare(name)==0) {
					// check if this word is in the search order 
					auto wordWid=defn.searchOrder; // wordlist number
					auto foundElement=std::find(searchOrder.begin(), searchOrder.end(), wordWid); // look this wordlist in searchOrder vector
					if(foundElement != searchOrder.end()){ // if found
						auto elementNum=std::distance(searchOrder.begin(),foundElement); // get element number
						if(elementNum>foundInWordlist){ // if element has more priority - use it
							foundInWordlist=elementNum; // new priority 
							nameXt=defn.numberInVector; // new xt for word
							if(foundInWordlist==(searchOrder.size()-1)){
								return nameXt; // if it has maximum priority - leave immediatelly
							}
						}
					}	
				}
			}
			return nameXt;
		}